

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O2

void UpdateModel(CPpmd8 *p)

{
  uint *puVar1;
  byte bVar2;
  byte bVar3;
  Byte BVar4;
  byte bVar5;
  byte bVar6;
  UInt16 UVar7;
  ushort uVar8;
  UInt16 UVar9;
  Byte BVar10;
  Byte BVar11;
  UInt16 UVar12;
  uint uVar13;
  uint uVar14;
  CTX_PTR pCVar15;
  CTX_PTR pCVar16;
  CPpmd8_Context *pCVar17;
  void *pvVar18;
  undefined4 *puVar19;
  byte bVar20;
  short sVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  Byte *pBVar25;
  short sVar26;
  ulong uVar27;
  ulong uVar28;
  CPpmd_State *pCVar29;
  CPpmd_State *pCVar30;
  CPpmd8_Context *c1;
  uint uVar31;
  CPpmd_State tmp;
  
  pCVar30 = p->FoundState;
  uVar14._0_2_ = pCVar30->SuccessorLow;
  uVar14._2_2_ = pCVar30->SuccessorHigh;
  uVar27 = (ulong)uVar14;
  bVar2 = pCVar30->Freq;
  bVar3 = pCVar30->Symbol;
  if ((bVar2 < 0x1f) && (uVar28 = (ulong)p->MinContext->Suffix, uVar28 != 0)) {
    pBVar25 = p->Base;
    if (pBVar25[uVar28] == '\0') {
      pCVar30 = (CPpmd_State *)(pBVar25 + uVar28 + 2);
      if (pBVar25[uVar28 + 3] < 0x20) {
        pBVar25[uVar28 + 3] = pBVar25[uVar28 + 3] + 1;
      }
    }
    else {
      pCVar30 = (CPpmd_State *)(pBVar25 + *(uint *)(pBVar25 + uVar28 + 4));
      if (pBVar25[*(uint *)(pBVar25 + uVar28 + 4)] != bVar3) {
        do {
          pCVar29 = pCVar30;
          pCVar30 = pCVar29 + 1;
        } while (pCVar29[1].Symbol != bVar3);
        if (pCVar29->Freq <= pCVar29[1].Freq) {
          UVar7 = pCVar29[1].SuccessorHigh;
          BVar10 = pCVar30->Symbol;
          BVar11 = pCVar30->Freq;
          UVar12 = pCVar30->SuccessorLow;
          pCVar29[1].SuccessorHigh = pCVar29->SuccessorHigh;
          BVar4 = pCVar29->Freq;
          UVar9 = pCVar29->SuccessorLow;
          pCVar30->Symbol = pCVar29->Symbol;
          pCVar30->Freq = BVar4;
          pCVar30->SuccessorLow = UVar9;
          pCVar29->SuccessorHigh = UVar7;
          pCVar29->Symbol = BVar10;
          pCVar29->Freq = BVar11;
          pCVar29->SuccessorLow = UVar12;
          pCVar30 = pCVar29;
        }
      }
      if (pCVar30->Freq < 0x73) {
        pCVar30->Freq = pCVar30->Freq + 2;
        *(short *)(pBVar25 + uVar28 + 2) = *(short *)(pBVar25 + uVar28 + 2) + 2;
      }
    }
  }
  else {
    pCVar30 = (CPpmd_State *)0x0;
  }
  c1 = p->MaxContext;
  if ((p->OrderFall == 0) && (uVar14 != 0)) {
    pCVar15 = CreateSuccessors(p,1,pCVar30,p->MinContext);
    pCVar30 = p->FoundState;
    if (pCVar15 == (CTX_PTR)0x0) {
      pCVar30->SuccessorLow = 0;
      pCVar30->SuccessorHigh = 0;
LAB_0016151f:
      RestoreModel(p,c1);
      return;
    }
    *(int *)&pCVar30->SuccessorLow = (int)pCVar15 - *(int *)&p->Base;
  }
  else {
    pBVar25 = p->Text;
    BVar4 = p->FoundState->Symbol;
    p->Text = pBVar25 + 1;
    *pBVar25 = BVar4;
    if (p->UnitsStart <= p->Text) goto LAB_0016151f;
    pBVar25 = p->Base;
    uVar28 = (long)p->Text - (long)pBVar25;
    if (uVar14 == 0) {
      pCVar15 = p->MinContext;
      pCVar29 = p->FoundState;
      uVar23 = (uint)uVar28;
      pCVar29->SuccessorLow = (short)uVar23;
      pCVar29->SuccessorHigh = (short)(uVar23 >> 0x10);
      uVar14 = p->OrderFall;
      pCVar16 = pCVar15;
      while( true ) {
        uVar14 = uVar14 + 1;
        uVar27 = (ulong)pCVar16->Suffix;
        if (pCVar30 == (CPpmd_State *)0x0) {
          if (uVar27 == 0) {
            p->OrderFall = uVar14;
            uVar27 = (ulong)(uint)((int)pCVar16 - (int)pBVar25);
            goto LAB_001616c0;
          }
          if (pBVar25[uVar27] == '\0') {
            pCVar30 = (CPpmd_State *)(pBVar25 + uVar27 + 2);
            pBVar25[uVar27 + 3] = pBVar25[uVar27 + 3] + (pBVar25[uVar27 + 3] < 0x20);
          }
          else {
            BVar4 = pBVar25[*(uint *)(pBVar25 + uVar27 + 4)];
            pCVar30 = (CPpmd_State *)(pBVar25 + *(uint *)(pBVar25 + uVar27 + 4));
            while (BVar4 != pCVar29->Symbol) {
              BVar4 = pCVar30[1].Symbol;
              pCVar30 = pCVar30 + 1;
            }
            if (pCVar30->Freq < 0x73) {
              pCVar30->Freq = pCVar30->Freq + 2;
              *(short *)(pBVar25 + uVar27 + 2) = *(short *)(pBVar25 + uVar27 + 2) + 2;
            }
          }
        }
        pCVar16 = (CTX_PTR)(pBVar25 + uVar27);
        uVar13 = (uint)pCVar30->SuccessorLow;
        uVar24._0_2_ = pCVar30->SuccessorLow;
        uVar24._2_2_ = pCVar30->SuccessorHigh;
        uVar31 = (uint)pCVar30->SuccessorHigh;
        if (uVar24 != 0) break;
        pCVar30->SuccessorLow = (UInt16)uVar28;
        pCVar30->SuccessorHigh = (UInt16)(uVar28 >> 0x10);
        pCVar30 = (CPpmd_State *)0x0;
      }
      p->OrderFall = uVar14;
      if (uVar24 <= uVar23) {
        p->FoundState = pCVar30;
        uVar13 = 0;
        pCVar16 = CreateSuccessors(p,0,(CPpmd_State *)0x0,pCVar16);
        if (pCVar16 == (CTX_PTR)0x0) {
          uVar31 = 0;
        }
        else {
          uVar13 = (int)pCVar16 - (int)p->Base;
          uVar31 = uVar13 >> 0x10;
        }
        pCVar30->SuccessorLow = (UInt16)uVar13;
        pCVar30->SuccessorHigh = (UInt16)uVar31;
        p->FoundState = pCVar29;
        uVar14 = p->OrderFall;
      }
      if ((uVar14 == 1) && (p->MaxContext == pCVar15)) {
        pCVar29->SuccessorLow = (UInt16)uVar13;
        pCVar29->SuccessorHigh = (UInt16)uVar31;
        p->Text = p->Text + -1;
        uVar13 = (uint)pCVar30->SuccessorLow;
        uVar31 = (uint)pCVar30->SuccessorHigh;
      }
      uVar14 = uVar31 << 0x10 | uVar13 & 0xffff;
      uVar27 = (ulong)uVar14;
      if (uVar14 == 0) goto LAB_0016151f;
    }
    else if (pBVar25 + uVar14 < p->UnitsStart) {
      pCVar15 = CreateSuccessors(p,0,pCVar30,p->MinContext);
      if (pCVar15 == (CTX_PTR)0x0) goto LAB_0016151f;
      uVar27 = (ulong)(uint)((int)pCVar15 - *(int *)&p->Base);
    }
LAB_001616c0:
    puVar1 = &p->OrderFall;
    *puVar1 = *puVar1 - 1;
    pCVar17 = p->MinContext;
    if (*puVar1 == 0) {
      p->Text = p->Text + -(ulong)(p->MaxContext != pCVar17);
      uVar28 = uVar27;
    }
    uVar8 = pCVar17->SummFreq;
    bVar5 = pCVar17->NumStats;
    for (; c1 != pCVar17; c1 = (CPpmd8_Context *)(pBVar25 + c1->Suffix)) {
      bVar6 = c1->NumStats;
      if (bVar6 == 0) {
        puVar19 = (undefined4 *)AllocUnits(p,0);
        if (puVar19 == (undefined4 *)0x0) goto LAB_0016151f;
        *(undefined2 *)(puVar19 + 1) = *(undefined2 *)((long)&c1->Stats + 2);
        *puVar19 = *(undefined4 *)&c1->SummFreq;
        c1->Stats = (int)puVar19 - *(int *)&p->Base;
        bVar20 = *(byte *)((long)puVar19 + 1) * '\x02';
        if (0x1d < *(byte *)((long)puVar19 + 1)) {
          bVar20 = 0x78;
        }
        *(byte *)((long)puVar19 + 1) = bVar20;
        uVar14 = p->InitEsc + (uint)(2 < bVar5) + (uint)bVar20;
      }
      else {
        if ((bVar6 & 1) != 0) {
          uVar14 = bVar6 + 1 >> 1;
          bVar20 = p->Units2Indx[uVar14 - 1];
          if (bVar20 != p->Units2Indx[uVar14]) {
            pvVar18 = AllocUnits(p,bVar20 + 1);
            if (pvVar18 == (void *)0x0) goto LAB_0016151f;
            pBVar25 = p->Base + c1->Stats;
            lVar22 = 0;
            do {
              *(undefined4 *)((long)pvVar18 + lVar22) = *(undefined4 *)(pBVar25 + lVar22);
              *(undefined4 *)((long)pvVar18 + lVar22 + 4) = *(undefined4 *)(pBVar25 + lVar22 + 4);
              *(undefined4 *)((long)pvVar18 + lVar22 + 8) = *(undefined4 *)(pBVar25 + lVar22 + 8);
              lVar22 = lVar22 + 0xc;
            } while ((bVar6 + 1 >> 1) * 0xc - (int)lVar22 != 0);
            InsertNode(p,pBVar25,(uint)bVar20);
            c1->Stats = (int)pvVar18 - *(int *)&p->Base;
          }
        }
        uVar14 = (uint)(ushort)(c1->SummFreq + (ushort)((uint)bVar6 * 3 + 1 < (uint)bVar5));
      }
      uVar24 = ((uVar14 & 0xffff) + 6) * (uint)bVar2 * 2;
      uVar23 = (uVar14 & 0xffff) + ((uint)uVar8 - ((uint)bVar2 + (uint)bVar5));
      if (uVar24 < uVar23 * 6) {
        sVar26 = 4;
        sVar21 = ((ushort)(uVar23 < uVar24) - (ushort)(uVar24 < uVar23 * 4)) + 2;
      }
      else {
        sVar26 = (ushort)(uVar23 * 0xc < uVar24) + (ushort)(uVar23 * 9 < uVar24) +
                 (ushort)(uVar23 * 0xf < uVar24) + 4;
        sVar21 = sVar26;
      }
      c1->SummFreq = sVar26 + (short)uVar14;
      pBVar25 = p->Base;
      uVar14 = c1->Stats;
      lVar22 = (ulong)bVar6 * 6;
      *(short *)(pBVar25 + lVar22 + 8 + (ulong)uVar14) = (short)uVar28;
      *(short *)(pBVar25 + lVar22 + 10 + (ulong)uVar14) = (short)(uVar28 >> 0x10);
      pBVar25[lVar22 + 6 + (ulong)uVar14] = bVar3;
      pBVar25[lVar22 + 7 + (ulong)uVar14] = (Byte)sVar21;
      c1->Flags = c1->Flags | (0x3f < bVar3) << 3;
      c1->NumStats = bVar6 + 1;
      pCVar17 = p->MinContext;
    }
    pCVar15 = (CTX_PTR)(p->Base + uVar27);
    p->MinContext = pCVar15;
  }
  p->MaxContext = pCVar15;
  return;
}

Assistant:

static void UpdateModel(CPpmd7 *p)
{
  CPpmd_Void_Ref successor, fSuccessor = SUCCESSOR(p->FoundState);
  CTX_PTR c;
  unsigned s0, ns;
  
  if (p->FoundState->Freq < MAX_FREQ / 4 && p->MinContext->Suffix != 0)
  {
    c = SUFFIX(p->MinContext);
    
    if (c->NumStats == 1)
    {
      CPpmd_State *s = ONE_STATE(c);
      if (s->Freq < 32)
        s->Freq++;
    }
    else
    {
      CPpmd_State *s = STATS(c);
      if (s->Symbol != p->FoundState->Symbol)
      {
        do { s++; } while (s->Symbol != p->FoundState->Symbol);
        if (s[0].Freq >= s[-1].Freq)
        {
          SwapStates(&s[0], &s[-1]);
          s--;
        }
      }
      if (s->Freq < MAX_FREQ - 9)
      {
        s->Freq += 2;
        c->SummFreq += 2;
      }
    }
  }

  if (p->OrderFall == 0)
  {
    p->MinContext = p->MaxContext = CreateSuccessors(p, True);
    if (p->MinContext == 0)
    {
      RestartModel(p);
      return;
    }
    SetSuccessor(p->FoundState, REF(p->MinContext));
    return;
  }
  
  *p->Text++ = p->FoundState->Symbol;
  successor = REF(p->Text);
  if (p->Text >= p->UnitsStart)
  {
    RestartModel(p);
    return;
  }
  
  if (fSuccessor)
  {
    if (fSuccessor <= successor)
    {
      CTX_PTR cs = CreateSuccessors(p, False);
      if (cs == NULL)
      {
        RestartModel(p);
        return;
      }
      fSuccessor = REF(cs);
    }
    if (--p->OrderFall == 0)
    {
      successor = fSuccessor;
      p->Text -= (p->MaxContext != p->MinContext);
    }
  }
  else
  {
    SetSuccessor(p->FoundState, successor);
    fSuccessor = REF(p->MinContext);
  }
  
  s0 = p->MinContext->SummFreq - (ns = p->MinContext->NumStats) - (p->FoundState->Freq - 1);
  
  for (c = p->MaxContext; c != p->MinContext; c = SUFFIX(c))
  {
    unsigned ns1;
    UInt32 cf, sf;
    if ((ns1 = c->NumStats) != 1)
    {
      if ((ns1 & 1) == 0)
      {
        /* Expand for one UNIT */
        unsigned oldNU = ns1 >> 1;
        unsigned i = U2I(oldNU);
        if (i != U2I(oldNU + 1))
        {
          void *ptr = AllocUnits(p, i + 1);
          void *oldPtr;
          if (!ptr)
          {
            RestartModel(p);
            return;
          }
          oldPtr = STATS(c);
          MyMem12Cpy(ptr, oldPtr, oldNU);
          InsertNode(p, oldPtr, i);
          c->Stats = STATS_REF(ptr);
        }
      }
      c->SummFreq = (UInt16)(c->SummFreq + (2 * ns1 < ns) + 2 * ((4 * ns1 <= ns) & (c->SummFreq <= 8 * ns1)));
    }
    else
    {
      CPpmd_State *s = (CPpmd_State*)AllocUnits(p, 0);
      if (!s)
      {
        RestartModel(p);
        return;
      }
      *s = *ONE_STATE(c);
      c->Stats = REF(s);
      if (s->Freq < MAX_FREQ / 4 - 1)
        s->Freq <<= 1;
      else
        s->Freq = MAX_FREQ - 4;
      c->SummFreq = (UInt16)(s->Freq + p->InitEsc + (ns > 3));
    }
    cf = 2 * (UInt32)p->FoundState->Freq * (c->SummFreq + 6);
    sf = (UInt32)s0 + c->SummFreq;
    if (cf < 6 * sf)
    {
      cf = 1 + (cf > sf) + (cf >= 4 * sf);
      c->SummFreq += 3;
    }
    else
    {
      cf = 4 + (cf >= 9 * sf) + (cf >= 12 * sf) + (cf >= 15 * sf);
      c->SummFreq = (UInt16)(c->SummFreq + cf);
    }
    {
      CPpmd_State *s = STATS(c) + ns1;
      SetSuccessor(s, successor);
      s->Symbol = p->FoundState->Symbol;
      s->Freq = (Byte)cf;
      c->NumStats = (UInt16)(ns1 + 1);
    }
  }
  p->MaxContext = p->MinContext = CTX(fSuccessor);
}